

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O0

void lyht_free(ly_ht *ht,_func_void_void_ptr *val_free)

{
  uint32_t local_28;
  uint local_24;
  uint32_t rec_idx;
  uint32_t hlist_idx;
  ly_ht_rec *rec;
  _func_void_void_ptr *val_free_local;
  ly_ht *ht_local;
  
  if (ht != (ly_ht *)0x0) {
    if (val_free != (_func_void_void_ptr *)0x0) {
      for (local_24 = 0; local_24 < ht->size; local_24 = local_24 + 1) {
        local_28 = ht->hlists[local_24].first;
        _rec_idx = lyht_get_rec(ht->recs,ht->rec_size,local_28);
        while (local_28 != 0xffffffff) {
          (*val_free)(_rec_idx->val);
          local_28 = _rec_idx->next;
          _rec_idx = lyht_get_rec(ht->recs,ht->rec_size,local_28);
        }
      }
    }
    free(ht->hlists);
    free(ht->recs);
    free(ht);
  }
  return;
}

Assistant:

LIBYANG_API_DEF void
lyht_free(struct ly_ht *ht, void (*val_free)(void *val_p))
{
    struct ly_ht_rec *rec;
    uint32_t hlist_idx;
    uint32_t rec_idx;

    if (!ht) {
        return;
    }

    if (val_free) {
        LYHT_ITER_ALL_RECS(ht, hlist_idx, rec_idx, rec) {
            val_free(&rec->val);
        }
    }
    free(ht->hlists);
    free(ht->recs);
    free(ht);
}